

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  undefined4 in_ESI;
  double *in_RDI;
  double dVar4;
  undefined1 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff89;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  undefined1 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  Value *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  Value *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar5;
  
  switch(in_ESI) {
  case 0:
    bVar1 = isNumeric(in_stack_ffffffffffffff90);
    bVar2 = false;
    if (bVar1) {
      dVar4 = asDouble(in_stack_ffffffffffffffb8);
      bVar5 = true;
      if ((dVar4 != 0.0) || (NAN(dVar4))) goto LAB_00128b74;
    }
    else {
LAB_00128b74:
      if ((((ulong)in_RDI[1] & 0xff) != 5) || (bVar5 = true, ((ulong)*in_RDI & 1) != 0)) {
        if (((ulong)in_RDI[1] & 0xff) == 4) {
          __lhs = &local_38;
          asString_abi_cxx11_((Value *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                             );
          bVar2 = true;
          bVar1 = std::operator==(__lhs,(char *)CONCAT17(in_stack_ffffffffffffff8f,
                                                         CONCAT16(in_stack_ffffffffffffff8e,
                                                                  CONCAT15(in_stack_ffffffffffffff8d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff8c,
                                                  CONCAT13(in_stack_ffffffffffffff8b,
                                                           CONCAT12(in_stack_ffffffffffffff8a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff89,
                                                  in_stack_ffffffffffffff88))))))));
          bVar5 = true;
          if (bVar1) goto LAB_00128c76;
        }
        if (((ulong)in_RDI[1] & 0xff) == 6) {
          sVar3 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                          *)0x128c1c);
          bVar5 = true;
          if (sVar3 == 0) goto LAB_00128c76;
        }
        if (((ulong)in_RDI[1] & 0xff) == 7) {
          sVar3 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                          *)0x128c4d);
          bVar5 = true;
          if (sVar3 == 0) goto LAB_00128c76;
        }
        bVar5 = ((ulong)in_RDI[1] & 0xff) == 0;
      }
    }
LAB_00128c76:
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_38);
    }
    break;
  case 1:
    bVar2 = isInt((Value *)CONCAT17(in_stack_ffffffffffffff9f,
                                    CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
    bVar5 = 1;
    if (!bVar2) {
      if (((ulong)in_RDI[1] & 0xff) == 3) {
        bVar2 = InRange<int,int>(*in_RDI,-0x80000000,0x7fffffff);
        bVar5 = 1;
        if (bVar2) break;
      }
      bVar5 = 1;
      if (((ulong)in_RDI[1] & 0xff) != 5) {
        bVar5 = ((ulong)in_RDI[1] & 0xff) == 0;
      }
    }
    break;
  case 2:
    bVar2 = isUInt((Value *)CONCAT17(in_stack_ffffffffffffff9f,
                                     CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)))
    ;
    bVar5 = 1;
    if (!bVar2) {
      if (((ulong)in_RDI[1] & 0xff) == 3) {
        bVar2 = InRange<int,unsigned_int>(*in_RDI,0,0xffffffff);
        bVar5 = 1;
        if (bVar2) break;
      }
      bVar5 = 1;
      if (((ulong)in_RDI[1] & 0xff) != 5) {
        bVar5 = ((ulong)in_RDI[1] & 0xff) == 0;
      }
    }
    break;
  case 3:
    bVar2 = isNumeric(in_stack_ffffffffffffff90);
    bVar5 = 1;
    if ((!bVar2) && (bVar5 = 1, ((ulong)in_RDI[1] & 0xff) != 5)) {
      bVar5 = ((ulong)in_RDI[1] & 0xff) == 0;
    }
    break;
  case 4:
    bVar2 = isNumeric(in_stack_ffffffffffffff90);
    bVar5 = 1;
    if (((!bVar2) && (bVar5 = 1, ((ulong)in_RDI[1] & 0xff) != 5)) &&
       (bVar5 = 1, ((ulong)in_RDI[1] & 0xff) != 4)) {
      bVar5 = ((ulong)in_RDI[1] & 0xff) == 0;
    }
    break;
  case 5:
    bVar2 = isNumeric(in_stack_ffffffffffffff90);
    bVar5 = 1;
    if ((!bVar2) && (bVar5 = 1, ((ulong)in_RDI[1] & 0xff) != 5)) {
      bVar5 = ((ulong)in_RDI[1] & 0xff) == 0;
    }
    break;
  case 6:
    bVar5 = 1;
    if (((ulong)in_RDI[1] & 0xff) != 6) {
      bVar5 = ((ulong)in_RDI[1] & 0xff) == 0;
    }
    break;
  case 7:
    bVar5 = 1;
    if (((ulong)in_RDI[1] & 0xff) != 7) {
      bVar5 = ((ulong)in_RDI[1] & 0xff) == 0;
    }
    break;
  default:
    bVar5 = 0;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type_ == booleanValue && value_.bool_ == false) ||
           (type_ == stringValue && asString() == "") ||
           (type_ == arrayValue && value_.map_->size() == 0) ||
           (type_ == objectValue && value_.map_->size() == 0) ||
           type_ == nullValue;
  case intValue:
    return isInt() ||
           (type_ == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case uintValue:
    return isUInt() ||
           (type_ == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case realValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case booleanValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case stringValue:
    return isNumeric() || type_ == booleanValue || type_ == stringValue ||
           type_ == nullValue;
  case arrayValue:
    return type_ == arrayValue || type_ == nullValue;
  case objectValue:
    return type_ == objectValue || type_ == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}